

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetPropertyStrict<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var value;
  bool bVar1;
  PropertyId pid;
  RecyclableObject *instance;
  ConstructorCache *pCVar2;
  InlineCache *local_30;
  InlineCache *inlineCache;
  
  value = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  pid = FunctionBody::GetPropertyIdFromCacheId
                  (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(value);
  if (bVar1) {
    instance = UnsafeVarTo<Js::RecyclableObject>(value);
    bVar1 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
                      (this,playout,pid,instance,&local_30,PropertyOperation_StrictMode);
    if (bVar1) {
      pCVar2 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
      if ((pCVar2->content).updateAfterCtor != true) {
        return;
      }
      InlineCache::RemoveFromInvalidationListAndClear
                (local_30,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
      return;
    }
  }
  DoSetProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,playout,value,PropertyOperation_StrictMode);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetPropertyStrict(unaligned T* playout)
    {
        DoSetProperty(playout, GetReg(playout->Instance), PropertyOperation_StrictMode);
    }